

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

void __thiscall
TestMaterial::initializeUniverse
          (TestMaterial *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *filenameList)

{
  bool bVar1;
  double dVar2;
  int iVar3;
  long lVar4;
  STP_BV *this_00;
  S_Polyhedron *this_01;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  string filename;
  string extension;
  undefined1 local_98 [16];
  double local_88 [3];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  lVar4 = *(long *)filenameList;
  if (*(long *)(filenameList + 8) != lVar4) {
    uVar6 = 0;
    uVar8 = 1;
    do {
      local_98._0_8_ = local_88;
      lVar5 = *(long *)(lVar4 + uVar6 * 0x20);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_98,lVar5,*(long *)(lVar4 + 8 + uVar6 * 0x20) + lVar5);
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"");
      lVar4 = std::__cxx11::string::find_last_of(local_98,0x105276,0xffffffffffffffff);
      if (lVar4 != -1) {
        std::__cxx11::string::find_last_of(local_98,0x105276,0xffffffffffffffff);
        std::__cxx11::string::substr((ulong)local_50,(ulong)local_98);
        std::__cxx11::string::operator=((string *)local_70,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
      }
      iVar3 = std::__cxx11::string::compare((char *)local_70);
      if (iVar3 == 0) {
        this_01 = (S_Polyhedron *)operator_new(0xf0);
        sch::S_Polyhedron::S_Polyhedron(this_01);
        (**(code **)(*(long *)this_01 + 0x30))(this_01,local_98);
        sch::CD_Scene::addObject((S_Object *)this);
      }
      else {
        this_00 = (STP_BV *)operator_new(0xe8);
        sch::STP_BV::STP_BV(this_00);
        (**(code **)(*(long *)this_00 + 0x48))(this_00,local_98);
        sch::CD_Scene::addObject((S_Object *)this);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      if ((double *)local_98._0_8_ != local_88) {
        operator_delete((void *)local_98._0_8_,(long)local_88[0] + 1);
      }
      lVar4 = *(long *)filenameList;
      bVar1 = uVar8 < (ulong)(*(long *)(filenameList + 8) - lVar4 >> 5);
      uVar6 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar1);
  }
  lVar4 = *(long *)&this->field_0x8;
  if (*(long *)&this->field_0x10 != lVar4) {
    lVar7 = -3;
    lVar5 = -2;
    uVar8 = 0;
    uVar6 = 0;
    uVar9 = 0;
    do {
      dVar2 = (double)(long)(lVar7 + (uVar6 / 3 & 0xfffffffffffffffe) * -3) * 0.8333333333333334 *
              0.2;
      local_98._8_4_ = SUB84(dVar2,0);
      local_98._0_8_ = (double)(long)(lVar5 + (uVar8 / 5) * -5) * 0.2;
      local_98._12_4_ = (int)((ulong)dVar2 >> 0x20);
      local_88[0] = (double)(long)((uVar6 / 7) * -7 + lVar7) * 0.7142857142857143 * 0.2;
      sch::S_Object::setPosition(*(Vector3T **)(lVar4 + uVar9 * 8));
      uVar9 = uVar9 + 1;
      lVar4 = *(long *)&this->field_0x8;
      lVar7 = lVar7 + 5;
      uVar6 = uVar6 + 5;
      lVar5 = lVar5 + 7;
      uVar8 = uVar8 + 7;
    } while (uVar9 < (ulong)(*(long *)&this->field_0x10 - lVar4 >> 3));
  }
  sch::CD_Scene::sceneProximityQuery();
  return;
}

Assistant:

void TestMaterial::initializeUniverse(const std::vector<std::string> & filenameList)
{
  for(unsigned i=0; i<filenameList.size(); ++i)
  {
    std::string filename = filenameList[i];
    std::string extension = "";
    if(filename.find_last_of(".") != std::string::npos)
    {
      extension = filename.substr(filename.find_last_of(".")+1);
    }
    if(extension == "otp")
    {
      S_Polyhedron* s = new S_Polyhedron();
      s->constructFromFile(filename);
      sObj.addObject(s);
    }
    else //if(extension == "txt")
    {
      STP_BV* s = new STP_BV();
      s->constructFromFileWithGL(filename);
      sObj.addObject(s);
    }
  }

  for (size_t i=0; i<sObj.size(); i++)
  {
    Vector3 position(
      Scalar(7*i%5)-2.,
      (Scalar(5*i%6)-3.)*(5.0/6.),
      (Scalar(5*i%7)-3.)*(5.0/7.)
    );
    position *= DispersionScale;
    sObj[i]->setPosition(position);
  }

  DoTest();
}